

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eln.c
# Opt level: O0

wchar_t el_get(EditLine *el,wchar_t op,...)

{
  el_pfunc_t *prf;
  undefined1 *puVar1;
  char in_AL;
  el_pfunc_t p_Var2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong uVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_148 [16];
  el_pfunc_t *local_138;
  undefined1 *local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  FILE **fpp;
  char *pcStack_88;
  wchar_t what;
  char *argv [3];
  wchar_t *pw;
  char **p_2;
  undefined1 *puStack_58;
  wchar_t wc;
  char *c;
  el_pfunc_t *p_1;
  el_pfunc_t *p;
  undefined4 local_38;
  wchar_t ret;
  va_list ap;
  wchar_t op_local;
  EditLine *el_local;
  
  puVar1 = local_130;
  prf = local_138;
  if (in_AL != '\0') {
    local_118 = in_XMM0_Qa;
    local_108 = in_XMM1_Qa;
    local_f8 = in_XMM2_Qa;
    local_e8 = in_XMM3_Qa;
    local_d8 = in_XMM4_Qa;
    local_c8 = in_XMM5_Qa;
    local_b8 = in_XMM6_Qa;
    local_a8 = in_XMM7_Qa;
  }
  if (el == (EditLine *)0x0) {
    el_local._4_4_ = L'\xffffffff';
  }
  else {
    ap[0].overflow_arg_area = local_148;
    ap[0]._0_8_ = &stack0x00000008;
    local_128 = in_R8;
    local_120 = in_R9;
    ap[0].reg_save_area._4_4_ = op;
    switch(op) {
    case L'\0':
    case L'\f':
      ret = L'0';
      local_38 = 0x18;
      local_138 = (el_pfunc_t *)in_RDX;
      local_130 = (undefined1 *)in_RCX;
      p._4_4_ = prompt_get(el,prf,(wchar_t *)0x0,op);
      break;
    case L'\x01':
      ret = L'0';
      local_38 = 0x18;
      local_138 = (el_pfunc_t *)in_RDX;
      local_130 = (undefined1 *)in_RCX;
      p._4_4_ = el_wget(el,op,prf);
      break;
    case L'\x02':
      ret = L'0';
      local_38 = 0x18;
      local_138 = (el_pfunc_t *)in_RDX;
      local_130 = (undefined1 *)in_RCX;
      p._4_4_ = el_wget(el,op,argv + 2);
      p_Var2 = (el_pfunc_t)ct_encode_string((wchar_t *)argv[2],&el->el_lgcyconv);
      *prf = p_Var2;
      if ((el->el_lgcyconv).csize == 0) {
        p._4_4_ = L'\xffffffff';
      }
      break;
    case L'\x03':
    case L'\v':
    case L'\x0f':
    case L'\x10':
    case L'\x19':
      ret = L'0';
      local_38 = 0x18;
      local_138 = (el_pfunc_t *)in_RDX;
      local_130 = (undefined1 *)in_RCX;
      p._4_4_ = el_wget(el,op,prf);
      break;
    default:
      p._4_4_ = L'\xffffffff';
      break;
    case L'\r':
      ret = L'0';
      local_38 = 0x18;
      local_138 = (el_pfunc_t *)in_RDX;
      local_130 = (undefined1 *)in_RCX;
      p._4_4_ = el_wget(el,op,prf);
      break;
    case L'\x0e':
      ret = L'0';
      local_38 = 0x18;
      local_138 = (el_pfunc_t *)in_RDX;
      local_130 = (undefined1 *)in_RCX;
      p._4_4_ = el_wget(el,op,prf);
      break;
    case L'\x11':
      ret = L'0';
      pcStack_88 = el_get::gettc;
      local_38 = 0x20;
      local_138 = (el_pfunc_t *)in_RDX;
      local_130 = (undefined1 *)in_RCX;
      p._4_4_ = terminal_gettc(el,L'\x03',&stack0xffffffffffffff78);
      break;
    case L'\x12':
      ret = L'0';
      fpp._4_4_ = local_138._0_4_;
      local_38 = 0x20;
      uVar3 = (ulong)local_138 & 0xffffffff;
      local_138 = (el_pfunc_t *)in_RDX;
      local_130 = (undefined1 *)in_RCX;
      p._4_4_ = el_wget(el,op,uVar3,puVar1);
      break;
    case L'\x15':
    case L'\x16':
      ret = L'0';
      local_38 = 0x20;
      puStack_58 = local_130;
      p_2._4_4_ = 0;
      local_138 = (el_pfunc_t *)in_RDX;
      local_130 = (undefined1 *)in_RCX;
      p._4_4_ = prompt_get(el,prf,(wchar_t *)((long)&p_2 + 4),op);
      *puStack_58 = (char)p_2._4_4_;
    }
    el_local._4_4_ = p._4_4_;
  }
  return el_local._4_4_;
}

Assistant:

int
el_get(EditLine *el, int op, ...)
{
	va_list ap;
	int ret;

	if (!el)
		return -1;

	va_start(ap, op);

	switch (op) {
	case EL_PROMPT:         /* el_pfunc_t * */
	case EL_RPROMPT: {
		el_pfunc_t *p = va_arg(ap, el_pfunc_t *);
		ret = prompt_get(el, p, 0, op);
		break;
	}

	case EL_PROMPT_ESC: /* el_pfunc_t *, char **/
	case EL_RPROMPT_ESC: {
		el_pfunc_t *p = va_arg(ap, el_pfunc_t *);
		char *c = va_arg(ap, char *);
		wchar_t wc = 0;
		ret = prompt_get(el, p, &wc, op);
		*c = (char)wc;
		break;
	}

	case EL_EDITOR: {
		const char **p = va_arg(ap, const char **);
		const wchar_t *pw;
		ret = el_wget(el, op, &pw);
		*p = ct_encode_string(pw, &el->el_lgcyconv);
		if (!el->el_lgcyconv.csize)
			ret = -1;
		break;
	}

	case EL_TERMINAL:       /* const char ** */
		ret = el_wget(el, op, va_arg(ap, const char **));
		break;

	case EL_SIGNAL:         /* int * */
	case EL_EDITMODE:
	case EL_SAFEREAD:
	case EL_UNBUFFERED:
	case EL_PREP_TERM:
		ret = el_wget(el, op, va_arg(ap, int *));
		break;

	case EL_GETTC: {
		char *argv[3];
		static char gettc[] = "gettc";
		argv[0] = gettc;
		argv[1] = va_arg(ap, char *);
		argv[2] = va_arg(ap, void *);
		ret = terminal_gettc(el, 3, argv);
		break;
	}

	case EL_GETCFN:         /* el_rfunc_t */
		ret = el_wget(el, op, va_arg(ap, el_rfunc_t *));
		break;

	case EL_CLIENTDATA:     /* void ** */
		ret = el_wget(el, op, va_arg(ap, void **));
		break;

	case EL_GETFP: {          /* int, FILE ** */
		int what = va_arg(ap, int);
		FILE **fpp = va_arg(ap, FILE **);
		ret = el_wget(el, op, what, fpp);
		break;
	}

	default:
		ret = -1;
		break;
	}

	va_end(ap);
	return ret;
}